

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void horizontal_filter_avx2
               (__m256i src,__m256i *horz_out,int sx,int alpha,int beta,int row,__m256i *shuffle_src
               ,__m256i *round_const,__m128i *shift)

{
  __m256i src_00;
  int in_stack_0000006c;
  __m128i *in_stack_00000070;
  __m256i *in_stack_00000078;
  __m256i *in_stack_000001c0;
  int in_stack_000001cc;
  int in_stack_000001d0;
  int in_stack_000001d4;
  
  prepare_horizontal_filter_coeff_avx2
            (in_stack_000001d4,in_stack_000001d0,in_stack_000001cc,in_stack_000001c0);
  src_00[1] = src[0];
  src_00[2] = src[1];
  src_00[3] = src[2];
  src_00[0] = (longlong)horz_out;
  filter_src_pixels_avx2
            (src_00,(__m256i *)CONCAT44(sx,alpha),(__m256i *)CONCAT44(beta,row),shuffle_src,
             in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  return;
}

Assistant:

static inline void horizontal_filter_avx2(const __m256i src, __m256i *horz_out,
                                          int sx, int alpha, int beta, int row,
                                          const __m256i *shuffle_src,
                                          const __m256i *round_const,
                                          const __m128i *shift) {
  __m256i coeff[4];
  prepare_horizontal_filter_coeff_avx2(alpha, beta, sx, coeff);
  filter_src_pixels_avx2(src, horz_out, coeff, shuffle_src, round_const, shift,
                         row);
}